

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gui.cpp
# Opt level: O2

void __thiscall nivalis::Plotter::reparse_expr(Plotter *this,size_t idx)

{
  Environment *pEVar1;
  Expr *this_00;
  Expr *pEVar2;
  pointer pFVar3;
  pointer pcVar4;
  pointer pAVar5;
  pointer pEVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  int iVar10;
  uint64_t uVar11;
  undefined7 extraout_var;
  long lVar12;
  uint32_t *puVar13;
  char cVar14;
  char *extraout_RDX;
  char *extraout_RDX_00;
  byte bVar15;
  string *psVar16;
  string *s;
  int64_t i;
  Function *pFVar17;
  Expr *point_expr;
  pointer this_01;
  ulong uVar18;
  string_view expr;
  initializer_list<unsigned_long> __l;
  string_view expr_00;
  Function *local_140;
  undefined8 local_138;
  uint local_12c;
  string *local_128;
  Environment *local_120;
  string funname;
  string lhs;
  string arg;
  uint64_t addr;
  string rhs;
  vector<unsigned_long,_std::allocator<unsigned_long>_> bindings;
  _Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> local_48;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&lhs,"x",(allocator<char> *)&rhs);
  pEVar1 = &this->env;
  uVar11 = Environment::addr_of(pEVar1,&lhs,false);
  this->x_var = (uint32_t)uVar11;
  std::__cxx11::string::~string((string *)&lhs);
  std::__cxx11::string::string<std::allocator<char>>((string *)&lhs,"y",(allocator<char> *)&rhs);
  uVar11 = Environment::addr_of(pEVar1,&lhs,false);
  this->y_var = (uint32_t)uVar11;
  std::__cxx11::string::~string((string *)&lhs);
  std::__cxx11::string::string<std::allocator<char>>((string *)&lhs,"t",(allocator<char> *)&rhs);
  local_120 = pEVar1;
  uVar11 = Environment::addr_of(pEVar1,&lhs,false);
  this->t_var = (uint32_t)uVar11;
  std::__cxx11::string::~string((string *)&lhs);
  pFVar3 = (this->funcs).super__Vector_base<nivalis::Function,_std::allocator<nivalis::Function>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pcVar4 = (this->func_error)._M_dataplus._M_p;
  (this->func_error)._M_string_length = 0;
  *pcVar4 = '\0';
  std::vector<nivalis::Expr,_std::allocator<nivalis::Expr>_>::clear(&pFVar3[idx].exprs);
  lhs._M_dataplus._M_p = (pointer)&lhs.field_2;
  lhs._M_string_length = 0;
  lhs.field_2._M_local_buf[0] = '\0';
  rhs._M_dataplus._M_p = (pointer)&rhs.field_2;
  rhs._M_string_length = 0;
  rhs.field_2._M_local_buf[0] = '\0';
  if (this->use_latex == true) {
    latex_to_nivalis(&funname,&pFVar3[idx].expr_str);
  }
  else {
    std::__cxx11::string::string((string *)&funname,(string *)&pFVar3[idx].expr_str);
  }
  iVar10 = anon_unknown_10::detect_func_type(&funname,&lhs,&rhs);
  pFVar17 = pFVar3 + idx;
  local_128 = &this->func_error;
  pFVar17->type = iVar10;
  std::__cxx11::string::~string((string *)&funname);
  local_12c = pFVar17->type & 0xfffffff8;
  local_138 = (ulong)local_138._4_4_ << 0x20;
  cVar14 = (char)&local_140;
  local_140 = pFVar17;
  switch((uint)pFVar17->type >> 3) {
  case 0:
  case 1:
  case 3:
    if (rhs._M_string_length == 1) {
      if (local_12c == 0) {
        cVar14 = 'y';
      }
      else if (local_12c == 0x18) {
        cVar14 = 'r';
      }
      else if (local_12c == 8) {
        cVar14 = 'x';
      }
      else {
        cVar14 = '\0';
      }
      psVar16 = &lhs;
      if (*rhs._M_dataplus._M_p != cVar14) goto LAB_00124921;
    }
    else {
LAB_00124921:
      psVar16 = &rhs;
    }
    parse((Expr *)&funname,psVar16,local_120,true,true,0,local_128);
    std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::_M_move_assign
              (&(local_140->expr).ast);
    std::_Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
    ~_Vector_base((_Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                  &funname);
    break;
  case 2:
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&bindings,
                   "(",&lhs);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&addr,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&bindings,
                   ")-(");
    pEVar1 = local_120;
    std::operator+(&arg,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&addr,
                   &rhs);
    std::operator+(&funname,&arg,")");
    parse((Expr *)&local_48,&funname,pEVar1,true,true,0,local_128);
    std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::_M_move_assign
              (&(local_140->expr).ast);
    std::_Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
    ~_Vector_base(&local_48);
    std::__cxx11::string::~string((string *)&funname);
    std::__cxx11::string::~string((string *)&arg);
    std::__cxx11::string::~string((string *)&addr);
    std::__cxx11::string::~string((string *)&bindings);
    break;
  default:
    goto switchD_0012436f_caseD_4;
  case 8:
    psVar16 = &lhs;
    uVar18 = std::__cxx11::string::find((char)psVar16,0x28);
    std::__cxx11::string::substr((ulong)&funname,(ulong)psVar16);
    util::trim((util *)&funname,psVar16);
    bindings.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bindings.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    bindings.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    bVar9 = false;
    local_138 = 0;
    lVar12 = 0;
    while (uVar18 = uVar18 + 1, uVar18 < lhs._M_string_length - 1) {
      cVar14 = lhs._M_dataplus._M_p[uVar18];
      if (cVar14 == ',') {
        if (lVar12 == 0) {
          psVar16 = &lhs;
          std::__cxx11::string::substr((ulong)&arg,(ulong)psVar16);
          util::trim((util *)&arg,psVar16);
          expr._M_str = extraout_RDX;
          expr._M_len = (size_t)arg._M_dataplus._M_p;
          bVar8 = util::is_varname((util *)arg._M_string_length,expr);
          bVar7 = true;
          if (bVar8) {
            addr = Environment::addr_of(local_120,&arg,false);
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back(&bindings,&addr);
            bVar7 = bVar9;
          }
          bVar9 = bVar7;
          std::__cxx11::string::~string((string *)&arg);
          if (!bVar8) break;
          lVar12 = 0;
        }
      }
      else if (cVar14 == ')') {
        lVar12 = lVar12 + -1;
      }
      else if (cVar14 == '(') {
        lVar12 = lVar12 + 1;
      }
      else {
        iVar10 = isspace((int)cVar14);
        local_138 = local_138 + (iVar10 == 0);
      }
    }
    pEVar1 = local_120;
    if ((!bVar9) && (local_138 != 0)) {
      psVar16 = &lhs;
      std::__cxx11::string::substr((ulong)&arg,(ulong)psVar16);
      util::trim((util *)&funname,psVar16);
      expr_00._M_str = extraout_RDX_00;
      expr_00._M_len = (size_t)arg._M_dataplus._M_p;
      bVar8 = util::is_varname((util *)arg._M_string_length,expr_00);
      bVar7 = true;
      if (bVar8) {
        addr = Environment::addr_of(pEVar1,&arg,false);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back(&bindings,&addr);
        bVar7 = bVar9;
      }
      bVar9 = bVar7;
      std::__cxx11::string::~string((string *)&arg);
    }
    if (bVar9) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&addr,
                     "Invalid argument name in function definition ",&lhs);
      std::operator+(&arg,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&addr
                     ,"\n");
      std::__cxx11::string::operator=((string *)local_128,(string *)&arg);
      std::__cxx11::string::~string((string *)&arg);
      std::__cxx11::string::~string((string *)&addr);
      local_138 = local_138 & 0xffffffff00000000;
    }
    else {
      parse((Expr *)&arg,&rhs,pEVar1,true,true,0,local_128);
      uVar11 = Environment::addr_of_func(pEVar1,&funname);
      Environment::def_func(pEVar1,&funname,(Expr *)&arg,&bindings);
      if ((this->env).error_msg._M_string_length != 0) {
        std::__cxx11::string::_M_assign((string *)local_128);
      }
      local_138 = CONCAT44(local_138._4_4_,(uint)(uVar11 == 0xffffffffffffffff));
      std::_Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
      ~_Vector_base((_Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *
                    )&arg);
    }
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              (&bindings.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
    std::__cxx11::string::~string((string *)&funname);
    goto switchD_0012436f_caseD_4;
  case 0x10:
  case 0x11:
    bVar9 = anon_unknown_10::parse_polyline_expr
                      (&lhs,pFVar17,local_120,this->x_var,this->y_var,this->t_var,local_128);
    local_138 = CONCAT44(local_138._4_4_,(int)CONCAT71(extraout_var,bVar9));
    if ((local_12c == 0x88) &&
       ((long)(local_140->exprs).super__Vector_base<nivalis::Expr,_std::allocator<nivalis::Expr>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)(local_140->exprs).super__Vector_base<nivalis::Expr,_std::allocator<nivalis::Expr>_>.
              _M_impl.super__Vector_impl_data._M_start != 0x60)) {
      std::__cxx11::string::assign((char *)local_128);
    }
    goto switchD_0012436f_caseD_4;
  case 0x12:
    lVar12 = std::__cxx11::string::find(cVar14 + 'P',0x40);
    if (lVar12 != -1) {
      std::__cxx11::string::substr((ulong)&funname,(ulong)&lhs);
      anon_unknown_10::parse_polyline_expr
                (&funname,local_140,local_120,this->x_var,this->y_var,this->t_var,local_128);
      std::__cxx11::string::~string((string *)&funname);
      std::__cxx11::string::substr((ulong)&funname,(ulong)&lhs);
      parse((Expr *)&arg,&funname,local_120,true,true,0,local_128);
      std::vector<nivalis::Expr,_std::allocator<nivalis::Expr>_>::emplace_back<nivalis::Expr>
                (&pFVar3[idx].exprs,(Expr *)&arg);
      std::_Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
      ~_Vector_base((_Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *
                    )&arg);
      std::__cxx11::string::~string((string *)&funname);
      if ((long)(local_140->exprs).super__Vector_base<nivalis::Expr,_std::allocator<nivalis::Expr>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(local_140->exprs).super__Vector_base<nivalis::Expr,_std::allocator<nivalis::Expr>_>
                ._M_impl.super__Vector_impl_data._M_start == 0x48) break;
    }
    std::__cxx11::string::assign((char *)local_128);
    break;
  case 0x13:
    lVar12 = std::__cxx11::string::find(cVar14 + 'P',0x40);
    if (lVar12 != -1) {
      std::__cxx11::string::substr((ulong)&funname,(ulong)&lhs);
      pEVar1 = local_120;
      anon_unknown_10::parse_polyline_expr
                (&funname,local_140,local_120,this->x_var,this->y_var,this->t_var,local_128);
      std::__cxx11::string::~string((string *)&funname);
      std::__cxx11::string::substr((ulong)&funname,(ulong)&lhs);
      pFVar17 = local_140;
      anon_unknown_10::parse_polyline_expr
                (&funname,local_140,pEVar1,this->x_var,this->y_var,this->t_var,local_128);
      std::__cxx11::string::~string((string *)&funname);
      if ((long)(pFVar17->exprs).super__Vector_base<nivalis::Expr,_std::allocator<nivalis::Expr>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(pFVar17->exprs).super__Vector_base<nivalis::Expr,_std::allocator<nivalis::Expr>_>.
                _M_impl.super__Vector_impl_data._M_start == 0x60) break;
    }
    std::__cxx11::string::assign((char *)local_128);
    break;
  case 0x14:
    lVar12 = std::__cxx11::string::find(cVar14 + 'P',0x40);
    if (lVar12 != -1) {
      std::__cxx11::string::substr((ulong)&funname,(ulong)&lhs);
      anon_unknown_10::parse_polyline_expr
                (&funname,local_140,local_120,this->x_var,this->y_var,this->t_var,local_128);
      std::__cxx11::string::~string((string *)&funname);
      std::__cxx11::string::substr((ulong)&funname,(ulong)&lhs);
      psVar16 = &local_140->str;
      s = &funname;
      std::__cxx11::string::operator=((string *)psVar16,(string *)&funname);
      std::__cxx11::string::~string((string *)&funname);
      util::trim((util *)psVar16,s);
      if ((long)(local_140->exprs).super__Vector_base<nivalis::Expr,_std::allocator<nivalis::Expr>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(local_140->exprs).super__Vector_base<nivalis::Expr,_std::allocator<nivalis::Expr>_>
                ._M_impl.super__Vector_impl_data._M_start == 0x30) break;
    }
    std::__cxx11::string::assign((char *)local_128);
  }
  local_138 = local_138 & 0xffffffff00000000;
switchD_0012436f_caseD_4:
  this_00 = &local_140->expr;
  bVar9 = Expr::is_null(this_00);
  if (bVar9) {
    Expr::ASTNode::ASTNode((ASTNode *)&funname,null);
    pAVar5 = (local_140->diff).ast.
             super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
             _M_impl.super__Vector_impl_data._M_start;
    *(pointer *)pAVar5 = funname._M_dataplus._M_p;
    (pAVar5->field_1).ref = funname._M_string_length;
  }
  else if (((local_12c != 0x28) && (local_12c != 0x40)) &&
          ((Expr::optimize(this_00,5), puVar13 = &this->y_var, local_12c == 8 ||
           (puVar13 = &this->x_var, local_12c == 0)))) {
    uVar18 = (ulong)*puVar13;
    Expr::diff((Expr *)&funname,this_00,uVar18,local_120);
    pEVar2 = &local_140->diff;
    std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::_M_move_assign
              (&pEVar2->ast);
    std::_Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
    ~_Vector_base((_Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                  &funname);
    bVar9 = Expr::is_null(pEVar2);
    if (bVar9) {
      Expr::ASTNode::ASTNode((ASTNode *)&funname,null);
      pAVar5 = (local_140->ddiff).ast.
               super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
               _M_impl.super__Vector_impl_data._M_start;
      *(pointer *)pAVar5 = funname._M_dataplus._M_p;
      (pAVar5->field_1).ref = funname._M_string_length;
    }
    else {
      Expr::diff((Expr *)&funname,pEVar2,uVar18,local_120);
      std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::_M_move_assign
                (&(local_140->ddiff).ast,&funname);
      std::_Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
      ~_Vector_base((_Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *
                    )&funname);
    }
    Expr::constant((Expr *)&arg,1.0);
    Expr::operator/((Expr *)&funname,(Expr *)&arg,this_00);
    pEVar2 = &local_140->recip;
    std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::_M_move_assign
              (&pEVar2->ast,&funname);
    std::_Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
    ~_Vector_base((_Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                  &funname);
    std::_Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
    ~_Vector_base((_Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                  &arg);
    Expr::optimize(pEVar2,5);
    Expr::diff((Expr *)&funname,pEVar2,uVar18,local_120);
    std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::_M_move_assign
              (&(local_140->drecip).ast,&funname);
    std::_Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
    ~_Vector_base((_Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                  &funname);
  }
  pEVar6 = (local_140->exprs).super__Vector_base<nivalis::Expr,_std::allocator<nivalis::Expr>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (this_01 = (local_140->exprs).
                 super__Vector_base<nivalis::Expr,_std::allocator<nivalis::Expr>_>._M_impl.
                 super__Vector_impl_data._M_start; this_01 != pEVar6; this_01 = this_01 + 1) {
    Expr::optimize(this_01,5);
  }
  if ((local_12c == 0) || (local_12c == 8)) {
    uVar11 = Environment::addr_of_func(local_120,&local_140->name);
    puVar13 = &this->x_var;
    if (local_12c == 8) {
      puVar13 = &this->y_var;
    }
    arg._M_dataplus._M_p = (pointer)(ulong)*puVar13;
    __l._M_len = 1;
    __l._M_array = (iterator)&arg;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&funname,__l,
               (allocator_type *)&addr);
    Environment::def_func
              (local_120,&local_140->name,this_00,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&funname);
    bVar15 = uVar11 == 0xffffffffffffffff | (byte)local_138;
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&funname);
    if ((this->env).error_msg._M_string_length != 0) {
      std::__cxx11::string::_M_assign((string *)local_128);
    }
LAB_00124c3b:
    if (bVar15 == 0) goto LAB_00124c70;
  }
  else {
    if (local_12c == 0x40) {
      bVar15 = (byte)local_138;
      goto LAB_00124c3b;
    }
    uVar11 = Environment::addr_of_func(local_120,&local_140->name);
    bVar15 = (byte)local_138;
    if (uVar11 == 0xffffffffffffffff) goto LAB_00124c3b;
    Environment::del_func(local_120,&local_140->name);
  }
  for (uVar18 = 0;
      uVar18 < (ulong)(((long)(this->funcs).
                              super__Vector_base<nivalis::Function,_std::allocator<nivalis::Function>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->funcs).
                             super__Vector_base<nivalis::Function,_std::allocator<nivalis::Function>_>
                             ._M_impl.super__Vector_impl_data._M_start) / 0x130);
      uVar18 = uVar18 + 1) {
    if (idx != uVar18) {
      reparse_expr(this,uVar18);
    }
  }
LAB_00124c70:
  this->loss_detail = false;
  this->require_update = true;
  std::__cxx11::string::~string((string *)&rhs);
  std::__cxx11::string::~string((string *)&lhs);
  return;
}

Assistant:

void Plotter::reparse_expr(size_t idx) {
    // Re-register some special vars, just in case they got deleted
    x_var = env.addr_of("x", false);
    y_var = env.addr_of("y", false);
    t_var = env.addr_of("t", false);

    auto& func = funcs[idx];
    func_error.clear();
    func.exprs.clear();
    std::string lhs, rhs;
    func.type = detect_func_type(use_latex ? latex_to_nivalis(func.expr_str) : func.expr_str, lhs, rhs);

    int ftype_nomod = func.type & ~Function::FUNC_TYPE_MOD_ALL;
    bool want_reparse_all = false;
    switch(ftype_nomod) {
        case Function::FUNC_TYPE_EXPLICIT:
        case Function::FUNC_TYPE_EXPLICIT_Y:
        case Function::FUNC_TYPE_POLAR:
            func.expr = parse((rhs.size() == 1 &&
                            rhs[0] == result_var_name_for_type(func.type)) ?
                            lhs : rhs,
                        env,
                        true, // mode explicit
                        true, // quiet
                        0, &func_error);
            break;
        case Function::FUNC_TYPE_IMPLICIT:
            func.expr = parse("(" + lhs + ")-(" + rhs + ")",
                    env, true, true, 0, &func_error);
            break;
        case Function::FUNC_TYPE_GEOM_POLYLINE:
        case Function::FUNC_TYPE_GEOM_RECT:
            // This is either polyline or parametric
            {
                // New variable may have been registered implicitly:
                // (a,b) creates variables a,b
                // so possibly have to reparse all
                want_reparse_all = parse_polyline_expr(lhs, func, env,
                        x_var, y_var, t_var, func_error);
                if (ftype_nomod == Function::FUNC_TYPE_GEOM_RECT && func.exprs.size() != 4) {
                    func_error = "Illegal %rect. Syntax: %rect (ax, ay) (bx, by)\n";
                }
            }
            break;
        case Function::FUNC_TYPE_GEOM_CIRCLE:
            {
                size_t rad_end_pos = lhs.find('@');
                if (rad_end_pos == std::string::npos) {
                    func_error = "%circ radius/center not specified. Syntax: %circ radius @ (cenx, ceny)\n";
                } else {
                    parse_polyline_expr(lhs.substr(rad_end_pos + 1), func, env,
                            x_var, y_var, t_var, func_error);
                    func.exprs.push_back(parse(lhs.substr(0, rad_end_pos), env, true, true, 0, &func_error));
                    if (func.exprs.size() != 3) {
                        func_error = "Illegal %circ. Syntax: %circ radius @ (cenx, ceny)\n";
                    }
                }
            }
            break;
        case Function::FUNC_TYPE_GEOM_ELLIPSE:
            {
                size_t rad_end_pos = lhs.find('@');
                if (rad_end_pos == std::string::npos) {
                    func_error = "%ellipse radius/center not specified. Syntax: %ellipse (rx, ry) @ (cenx, ceny)\n";
                } else {
                    parse_polyline_expr(lhs.substr(rad_end_pos + 1), func, env,
                            x_var, y_var, t_var, func_error);
                    parse_polyline_expr(lhs.substr(0, rad_end_pos), func, env,
                            x_var, y_var, t_var, func_error);
                    if (func.exprs.size() != 4) {
                        func_error = "Illegal %ellipse. Syntax: %ellipse (rx, ry) @ (cenx, ceny)\n";
                    }
                }
            }
            break;
        case Function::FUNC_TYPE_GEOM_TEXT:
            {
                size_t rad_end_pos = lhs.find('@');
                if (rad_end_pos == std::string::npos) {
                    func_error = "%text text/position not specified. Syntax: %text text @ (x, y)\n";
                } else {
                    parse_polyline_expr(lhs.substr(rad_end_pos + 1), func, env,
                            x_var, y_var, t_var, func_error);
                    func.str = lhs.substr(0, rad_end_pos);
                    util::trim(func.str);
                    if (func.exprs.size() != 2) {
                        func_error = "Illegal %text. Syntax: %text text @ (x, y)\n";
                    }
                }
            }
            break;
        case Function::FUNC_TYPE_FUNC_DEFINITION:
            {
                size_t funname_end = lhs.find('(');
                std::string funname = lhs.substr(0, funname_end);
                util::trim(funname);
                int64_t stkh = 0, last_begin = funname_end + 1;
                size_t argcount = 0, non_space_count = 0;
                std::vector<uint64_t> bindings;
                bool bad = false;
                for (int64_t i = funname_end + 1; i < lhs.size()- 1; ++i) {
                    const char cc = lhs[i];
                    if (cc == '(') {
                        ++stkh;
                    } else if (cc == ')') {
                        --stkh;
                    } else if (cc == ',') {
                        if (stkh == 0) {
                            std::string arg = lhs.substr(last_begin, i - last_begin);
                            util::trim(arg);
                            if (!util::is_varname(arg)) {
                                bad = true;
                                break;
                            }
                            auto addr = env.addr_of(arg, false);
                            bindings.push_back(addr);
                            last_begin = i+1;
                            ++argcount;
                        }
                    } else if (!std::isspace(cc)) {
                        ++non_space_count;
                    }
                }
                if (!bad && non_space_count) {
                    ++argcount;
                    std::string arg = lhs.substr(last_begin, lhs.size() - last_begin - 1);
                    util::trim(funname);
                    if (!util::is_varname(arg)) {
                        bad = true;
                    } else {
                        auto addr = env.addr_of(arg, false);
                        bindings.push_back(addr);
                    }
                } // else: function call with no args
                if (bad) {
                    func_error = "Invalid argument name in function definition " + lhs + "\n";
                } else {
                    Expr expr = parse(rhs, env, true, true, 0, &func_error);
                    if (env.addr_of_func(funname) == -1) {
                        // Since new function defined, other expressions may change meaning,
                        // so must reparse all
                        want_reparse_all = true;
                    }
                    auto addr = env.def_func(funname, expr, bindings);
                    if (env.error_msg.size()) {
                        func_error = env.error_msg;
                    }
                }
            }
            break;
    }

    if (!func.expr.is_null()) {
        // Optimize the main expression
        if (ftype_nomod != Function::FUNC_TYPE_PARAMETRIC &&
            ftype_nomod != Function::FUNC_TYPE_FUNC_DEFINITION)
            func.expr.optimize();

        // Compute derivatives, if explicit
        if (ftype_nomod == Function::FUNC_TYPE_EXPLICIT ||
            ftype_nomod == Function::FUNC_TYPE_EXPLICIT_Y) {
            uint64_t var = ftype_nomod == Function::FUNC_TYPE_EXPLICIT_Y ?  y_var : x_var;
            func.diff = func.expr.diff(var, env);
            if (!func.diff.is_null()) {
                func.ddiff = func.diff.diff(var, env);
            }
            else func.ddiff.ast[0] = OpCode::null;
            func.recip = Expr::constant(1.) / func.expr;
            func.recip.optimize();
            func.drecip = func.recip.diff(var, env);
        }
    } else func.diff.ast[0] = OpCode::null;

    // Optimize any polyline/parametric point expressions
    for (auto& point_expr : func.exprs) {
        point_expr.optimize();
    }

    if (ftype_nomod == Function::FUNC_TYPE_EXPLICIT
        || ftype_nomod == Function::FUNC_TYPE_EXPLICIT_Y) {
        if (env.addr_of_func(func.name) == -1) {
            want_reparse_all = true;
        }
        // Register a function in env
        env.def_func(func.name, func.expr, { ftype_nomod == Function::FUNC_TYPE_EXPLICIT_Y ? y_var : x_var });
        if (env.error_msg.size()) {
            func_error = env.error_msg;
        }
    } else if (ftype_nomod != Function::FUNC_TYPE_FUNC_DEFINITION) {
        if (env.addr_of_func(func.name) != -1) {
            env.del_func(func.name);
            want_reparse_all = true;
        }
    }

    if (want_reparse_all) {
        // Possibly re-parse other expressions
        for (size_t i = 0; i < funcs.size(); ++i) {
            if (i != idx) {
                reparse_expr(i);
            }
        }
    }
    loss_detail = false;
    require_update = true;
}